

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbojpeg.c
# Opt level: O1

int tjDestroy(tjhandle handle)

{
  int iVar1;
  undefined8 *puVar2;
  int iVar3;
  
  if (handle == (tjhandle)0x0) {
    puVar2 = (undefined8 *)__tls_get_addr(&PTR_0019df20);
    *(undefined8 *)((long)puVar2 + 7) = 0x656c646e616820;
    *puVar2 = 0x2064696c61766e49;
    iVar3 = -1;
  }
  else {
    *(undefined4 *)((long)handle + 0x5f8) = 0;
    *(undefined4 *)((long)handle + 0x6d0) = 0;
    iVar1 = _setjmp((__jmp_buf_tag *)((long)handle + 0x528));
    iVar3 = -1;
    if (iVar1 == 0) {
      if ((*(byte *)((long)handle + 0x600) & 1) != 0) {
        jpeg_destroy_compress((j_compress_ptr)handle);
      }
      if ((*(byte *)((long)handle + 0x600) & 2) != 0) {
        jpeg_destroy_decompress((j_decompress_ptr)((long)handle + 0x208));
      }
      free(handle);
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

DLLEXPORT int tjDestroy(tjhandle handle)
{
  GET_INSTANCE(handle);

  if (setjmp(this->jerr.setjmp_buffer)) return -1;
  if (this->init & COMPRESS) jpeg_destroy_compress(cinfo);
  if (this->init & DECOMPRESS) jpeg_destroy_decompress(dinfo);
  free(this);
  return 0;
}